

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O1

size_t value_to_string(CrispyValue value,char **dest)

{
  size_t __n;
  char *pcVar1;
  size_t sVar2;
  char *__s;
  anon_union_8_3_4e733eb7_for_CrispyValue_1 dict;
  ObjString *obj_string;
  char s [23];
  char local_38 [24];
  
  dict = value.field_1;
  switch(value.type) {
  case NIL:
    pcVar1 = strdup("nil");
    sVar2 = 3;
    break;
  case NUMBER:
    __s = local_38;
    snprintf(__s,0x17,"%.15g",dict.d_value);
    pcVar1 = strdup(__s);
LAB_00102af2:
    sVar2 = strlen(__s);
    break;
  case OBJECT:
    switch((dict.o_value)->type) {
    case OBJ_STRING:
      __n = *(size_t *)(dict.p_value + 0x10);
      pcVar1 = (char *)malloc(__n + 3);
      memcpy(pcVar1 + 1,*(void **)(dict.p_value + 0x18),__n);
      *pcVar1 = '\"';
      pcVar1[*(long *)(dict.p_value + 0x10) + 1] = '\"';
      pcVar1[*(long *)(dict.p_value + 0x10) + 2] = '\0';
      sVar2 = *(long *)(dict.p_value + 0x10) + 2;
      break;
    case OBJ_LAMBDA:
      pcVar1 = strdup("<function>");
      sVar2 = 10;
      break;
    case OBJ_NATIVE_FUNC:
      pcVar1 = strdup("<native function>");
      sVar2 = 0x11;
      break;
    case OBJ_DICT:
      __s = dict_to_string((ObjDict *)dict.o_value);
      pcVar1 = __s;
      goto LAB_00102af2;
    case OBJ_LIST:
      pcVar1 = strdup("<list>");
      sVar2 = 6;
      break;
    default:
      goto switchD_00102a1c_default;
    }
    break;
  case BOOLEAN:
    if ((ObjDict *)dict.p_value == (ObjDict *)0x0) {
      pcVar1 = strdup("false");
      sVar2 = 5;
    }
    else {
      pcVar1 = strdup("true");
      sVar2 = 4;
    }
    break;
  default:
switchD_00102a1c_default:
    sVar2 = 0;
    pcVar1 = (char *)0x0;
  }
  *dest = pcVar1;
  return sVar2;
}

Assistant:

size_t value_to_string(CrispyValue value, char **dest) {
    char *string = NULL;
    size_t str_len = 0;

    switch (value.type) {
        case NUMBER: {
            char s[23];
            snprintf(s, 23, "%.15g", value.d_value);
            string = strdup(s);
            str_len = strlen(s);
            break;
        }
        case OBJECT: {
            Object *object = value.o_value;

            switch (object->type) {
                case OBJ_STRING: {
                    ObjString *obj_string = ((ObjString *) object);
                    string = malloc((obj_string->length + 3) * sizeof(char));
                    memcpy(string + 1, obj_string->start, obj_string->length);
                    string[0] = '"';
                    string[obj_string->length + 1] = '"';
                    string[obj_string->length + 2] = '\0';
                    str_len = ((ObjString *) object)->length + 2;
                    break;
                }
                case OBJ_LAMBDA:
                    // TODO arity
                    string = strdup("<function>");
                    str_len = 10;
                    break;
                case OBJ_NATIVE_FUNC:
                    // TODO arity
                    string = strdup("<native function>");
                    str_len = 17;
                    break;
                case OBJ_DICT: {
                    char *dict_string = dict_to_string((ObjDict *) object);
                    string = dict_string;
                    str_len = strlen(dict_string);
                    break;
                }
                case OBJ_LIST:
                    // TODO implement properly
                    string = strdup("<list>");
                    str_len = 6;
                    break;
            }
            break;
        }
        case BOOLEAN: {
            if (value.p_value) {
                string = strdup("true");
                str_len = 4;
            } else {
                string = strdup("false");
                str_len = 5;
            }
            break;
        }
        case NIL:
            string = strdup("nil");
            str_len = 3;
            break;
    }

    *dest = string;
    return str_len;
}